

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_rc_pick_q_and_bounds
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  RATE_CONTROL *pRVar1;
  byte bVar2;
  byte bVar3;
  FRAME_UPDATE_TYPE FVar4;
  aom_rc_mode intra_only;
  aom_superres_mode superres_denom;
  aom_bit_depth_t aVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  SequenceHeader *pSVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  AV1_PRIMARY *pAVar11;
  undefined *puVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  YV12_BUFFER_CONFIG *pYVar16;
  bool bVar17;
  uint uVar18;
  RefCntBuffer *pRVar19;
  int j;
  long lVar20;
  AV1_PRIMARY *pAVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  FRAME_TYPE frame_type;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  undefined1 *puVar27;
  uint *puVar28;
  uint uVar29;
  uint uVar30;
  double dVar31;
  double dVar32;
  uint sse;
  uint local_1094;
  AV1_PRIMARY *local_1090;
  RATE_CONTROL *local_1088;
  uint local_1080;
  int local_107c;
  uint *local_1078;
  uint *local_1070;
  uint local_1068;
  uint local_1064;
  long local_1060;
  long local_1058;
  long local_1050;
  ulong local_1048;
  long local_1040;
  uint local_1038 [48];
  undefined1 local_f78 [3912];
  
  pAVar21 = cpi->ppi;
  intra_only = (cpi->oxcf).rc_cfg.mode;
  local_1060 = (long)gf_index;
  local_1090 = pAVar21;
  local_1078 = (uint *)top_index;
  local_1070 = (uint *)bottom_index;
  if ((((intra_only != AOM_Q) || ((pAVar21->gf_group).update_type[local_1060] == '\x03')) &&
      ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) && (pAVar21->lap_enabled == 0)) {
    if (intra_only == AOM_CBR) {
      cpi->rec_sse = 0xffffffffffffffff;
      if ((((cpi->sf).hl_sf.accurate_bit_estimate != 0) &&
          ((cpi->common).current_frame.frame_type != '\0')) &&
         (pYVar6 = cpi->unscaled_source, pYVar6 != (YV12_BUFFER_CONFIG *)0x0)) {
        lVar15 = (long)(cpi->common).remapped_ref_idx[0];
        if (lVar15 == -1) {
          pRVar19 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar19 = (cpi->common).ref_frame_map[lVar15];
        }
        pYVar16 = &pRVar19->buf;
        if (pRVar19 == (RefCntBuffer *)0x0) {
          pYVar16 = (YV12_BUFFER_CONFIG *)0x0;
        }
        if (cpi->scaled_ref_buf[0] == (RefCntBuffer *)0x0) {
          puVar23 = (pYVar6->field_5).buffers[0];
          iVar9 = (pYVar6->field_4).field_0.y_stride;
          puVar22 = (pYVar16->field_5).field_0.y_buffer;
          local_107c = (pYVar16->field_4).field_0.y_stride;
          lVar15 = 0;
          bVar8 = true;
          do {
            bVar17 = bVar8;
            if ((*(int *)((long)pYVar6->store_buf_adr + lVar15 * 4 + -0x48) !=
                 *(int *)((long)pYVar16->store_buf_adr + lVar15 * 4 + -0x48)) ||
               (*(int *)((long)pYVar6->store_buf_adr + lVar15 * 4 + -0x40) !=
                *(int *)((long)pYVar16->store_buf_adr + lVar15 * 4 + -0x40))) goto LAB_0020136a;
            lVar15 = 1;
            bVar8 = false;
          } while (bVar17);
          pSVar7 = (cpi->common).seq_params;
          iVar14 = pSVar7->mib_size >> (pSVar7->sb_size == BLOCK_128X128);
          uVar13 = (long)((cpi->common).mi_params.mi_cols + iVar14 + -1) / (long)iVar14;
          uVar25 = uVar13 & 0xffffffff;
          local_1080 = (iVar14 + -1 + (cpi->common).mi_params.mi_rows) / iVar14;
          cpi->rec_sse = 0;
          if (0 < (int)local_1080) {
            local_1068 = (uint)uVar13;
            local_1050 = (long)(int)((iVar9 - local_1068) * 0x40);
            local_1058 = (long)(int)((local_107c - local_1068) * 0x40);
            uVar13 = 0;
            lVar15 = 0;
            do {
              local_1048 = uVar13;
              if (0 < (int)uVar25) {
                uVar29 = 0;
                do {
                  local_1088 = (RATE_CONTROL *)puVar22;
                  local_1064 = uVar29;
                  local_1040 = lVar15;
                  memset(local_1038,0,0x1000);
                  puVar27 = local_f78;
                  lVar15 = 0;
                  puVar22 = puVar23;
                  do {
                    lVar20 = 0;
                    do {
                      uVar29 = aom_avg_4x4_sse2(puVar22 + lVar20,iVar9);
                      pRVar1 = local_1088;
                      iVar14 = (uVar29 & 0xff) * 0x1010101;
                      *(int *)(puVar27 + lVar20 + -0xc0) = iVar14;
                      *(int *)(puVar27 + lVar20 + -0x80) = iVar14;
                      *(int *)(puVar27 + lVar20 + -0x40) = iVar14;
                      *(int *)(puVar27 + lVar20) = iVar14;
                      lVar20 = lVar20 + 4;
                    } while (lVar20 != 0x40);
                    lVar15 = lVar15 + 1;
                    puVar22 = puVar22 + (long)iVar9 * 4;
                    puVar27 = puVar27 + 0x100;
                  } while (lVar15 != 0x10);
                  (*cpi->ppi->fn_ptr[0xc].vf)
                            ((uint8_t *)local_1038,0x40,(uint8_t *)local_1088,local_107c,&local_1094
                            );
                  lVar15 = local_1040 + (ulong)local_1094;
                  puVar23 = puVar23 + 0x40;
                  puVar22 = (uint8_t *)((long)pRVar1 + 0x40);
                  uVar29 = local_1064 + 1;
                  uVar25 = (ulong)local_1068;
                } while (uVar29 != local_1068);
              }
              puVar22 = puVar22 + local_1058;
              puVar23 = puVar23 + local_1050;
              uVar29 = (int)local_1048 + 1;
              uVar13 = (ulong)uVar29;
            } while (uVar29 != local_1080);
            iVar9 = 0;
            if (0 < (int)uVar25) {
              iVar9 = (int)uVar25;
            }
            if (0 < (int)(local_1080 * iVar9)) {
              cpi->rec_sse = lVar15 + (ulong)(lVar15 == 0);
            }
          }
        }
      }
LAB_0020136a:
      pAVar21 = local_1090;
      pAVar11 = cpi->ppi;
      uVar29 = calc_active_worst_quality_no_stats_cbr(cpi);
      aVar5 = ((cpi->common).seq_params)->bit_depth;
      if (aVar5 - AOM_BITS_8 < 5) {
        puVar12 = (&PTR_rtc_minq_8_005cc980)[aVar5 - AOM_BITS_8];
      }
      else {
        puVar12 = (undefined *)0x0;
      }
      uVar26 = (cpi->rc).best_quality;
      if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
        if ((pAVar11->p_rc).this_key_frame_forced == 0) {
          uVar18 = uVar26;
          if ((cpi->common).current_frame.frame_number != 0) {
            iVar9 = get_kf_active_quality(&pAVar11->p_rc,(pAVar11->p_rc).avg_frame_qindex[0],aVar5);
            dVar31 = av1_convert_qindex_to_q(iVar9,aVar5);
            pAVar21 = local_1090;
            iVar14 = av1_compute_qdelta(&cpi->rc,dVar31,
                                        *(double *)
                                         (&DAT_004fd280 + (ulong)(height * width < 0x18c01) * 8) *
                                        dVar31,aVar5);
            uVar26 = (cpi->rc).best_quality;
            uVar18 = iVar14 + iVar9;
          }
        }
        else {
          iVar9 = (pAVar11->p_rc).last_boosted_qindex;
          dVar31 = av1_convert_qindex_to_q(iVar9,aVar5);
          iVar14 = av1_compute_qdelta(&cpi->rc,dVar31,dVar31 * 0.75,aVar5);
          uVar18 = iVar14 + iVar9;
          uVar26 = (cpi->rc).best_quality;
          if ((int)uVar18 <= (int)uVar26) {
            uVar18 = uVar26;
          }
        }
      }
      else if ((((cpi->rc).is_src_frame_alt_ref == 0) && (pAVar11->use_svc == 0)) &&
              (((cpi->oxcf).rc_cfg.gf_cbr_boost_pct != 0 &&
               (((cpi->refresh_frame).golden_frame != false ||
                ((cpi->refresh_frame).alt_ref_frame == true)))))) {
        uVar18 = uVar29;
        if ((1 < (cpi->rc).frames_since_key) &&
           (uVar18 = (pAVar11->p_rc).avg_frame_qindex[1], (int)uVar29 <= (int)uVar18)) {
          uVar18 = uVar29;
        }
        uVar18 = get_gf_active_quality
                           ((PRIMARY_RATE_CONTROL *)(ulong)(uint)(pAVar11->p_rc).gfu_boost,uVar18,
                            aVar5);
      }
      else {
        uVar18 = (pAVar11->p_rc).avg_frame_qindex[1 < (cpi->common).current_frame.frame_number];
        if ((int)uVar29 <= (int)uVar18) {
          uVar18 = uVar29;
        }
        uVar18 = *(uint *)(puVar12 + (long)(int)uVar18 * 4);
      }
      puVar28 = local_1078;
      uVar10 = (cpi->rc).worst_quality;
      uVar30 = uVar10;
      if ((int)uVar18 < (int)uVar10) {
        uVar30 = uVar18;
      }
      if ((int)uVar18 < (int)uVar26) {
        uVar30 = uVar26;
      }
      if ((int)uVar29 < (int)uVar10) {
        uVar10 = uVar29;
      }
      if ((int)uVar29 < (int)uVar30) {
        uVar10 = uVar30;
      }
      *local_1078 = uVar10;
      *local_1070 = uVar30;
      if ((((cpi->common).current_frame.frame_type == '\0') &&
          ((pAVar11->p_rc).this_key_frame_forced == 0)) &&
         ((cpi->common).current_frame.frame_number != 0)) {
        iVar9 = av1_compute_qdelta_by_rate(cpi,'\0',uVar10,2.0);
        uVar29 = iVar9 + uVar10;
        *puVar28 = uVar29;
        if ((int)uVar29 <= (int)*local_1070) {
          uVar29 = *local_1070;
        }
        *puVar28 = uVar29;
      }
      uVar26 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar30,uVar10,width,height);
      uVar29 = *puVar28;
      uVar10 = uVar26;
      if (((int)uVar29 < (int)uVar26) &&
         (uVar10 = uVar29, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
        *puVar28 = uVar26;
        uVar29 = uVar26;
        uVar10 = uVar26;
      }
      (cpi->rc).active_worst_quality = uVar29;
      goto LAB_0020112b;
    }
    pRVar1 = &cpi->rc;
    bVar2 = (cpi->common).current_frame.frame_type;
    uVar18 = get_active_cq_level(pRVar1,&pAVar21->p_rc,
                                 (AV1EncoderConfig *)(ulong)(uint)(cpi->oxcf).rc_cfg.cq_level,
                                 intra_only,(uint)((bVar2 & 0xfd) == 0),cpi->superres_mode);
    aVar5 = ((cpi->common).seq_params)->bit_depth;
    uVar29 = (cpi->common).current_frame.frame_number;
    uVar26 = (pAVar21->p_rc).last_q[0];
    if (bVar2 == 0) {
      if (uVar29 == 0) {
        uVar10 = (cpi->rc).worst_quality;
      }
      else {
        uVar10 = uVar26 * 2;
      }
    }
    else {
      uVar10 = (pAVar21->p_rc).last_q[1];
      if (((cpi->rc).is_src_frame_alt_ref == 0) &&
         ((((cpi->refresh_frame).golden_frame != false ||
           ((cpi->refresh_frame).bwd_ref_frame != false)) ||
          ((cpi->refresh_frame).alt_ref_frame == true)))) {
        if (uVar29 == 1) {
          iVar9 = uVar26 * 5 + 3;
          if (-1 < (int)(uVar26 * 5)) {
            iVar9 = uVar26 * 5;
          }
          uVar10 = iVar9 >> 2;
        }
      }
      else {
        if (uVar29 == 1) {
          uVar10 = uVar26;
        }
        uVar10 = uVar10 * 2;
      }
    }
    uVar26 = (cpi->rc).worst_quality;
    if ((int)uVar10 < (int)uVar26) {
      uVar26 = uVar10;
    }
    if (aVar5 - AOM_BITS_8 < 5) {
      puVar12 = (&PTR_inter_minq_8_005cca48)[aVar5 - AOM_BITS_8];
    }
    else {
      puVar12 = (undefined *)0x0;
    }
    local_1088 = pRVar1;
    if ((bVar2 & 0xfd) == 0) {
      if (intra_only == AOM_Q) {
        dVar32 = av1_convert_qindex_to_q(uVar18,aVar5);
        dVar31 = 0.25;
LAB_00201238:
        iVar9 = av1_compute_qdelta(local_1088,dVar32,dVar31 * dVar32,aVar5);
        uVar10 = (cpi->rc).best_quality;
        uVar29 = iVar9 + uVar18;
        if ((int)(iVar9 + uVar18) <= (int)uVar10) {
          uVar29 = uVar10;
        }
      }
      else {
        if ((pAVar21->p_rc).this_key_frame_forced != 0) {
          uVar18 = (pAVar21->p_rc).last_boosted_qindex;
          dVar31 = av1_convert_qindex_to_q(uVar18,aVar5);
          dVar32 = 0.75;
          goto LAB_00201324;
        }
        iVar9 = get_kf_active_quality(&pAVar21->p_rc,(pAVar21->p_rc).avg_frame_qindex[0],aVar5);
        dVar31 = av1_convert_qindex_to_q(iVar9,aVar5);
        pAVar21 = local_1090;
        iVar14 = av1_compute_qdelta(local_1088,dVar31,
                                    *(double *)
                                     (&DAT_004fd280 + (ulong)(height * width < 0x18c01) * 8) *
                                    dVar31,aVar5);
        uVar29 = iVar14 + iVar9;
      }
    }
    else if (((cpi->rc).is_src_frame_alt_ref == 0) &&
            (((cpi->refresh_frame).golden_frame != false ||
             ((cpi->refresh_frame).alt_ref_frame == true)))) {
      if (((cpi->rc).frames_since_key < 2) ||
         (uVar29 = (pAVar21->p_rc).avg_frame_qindex[1], (int)uVar26 <= (int)uVar29)) {
        uVar29 = (pAVar21->p_rc).avg_frame_qindex[0];
      }
      if (intra_only == AOM_Q) {
        dVar31 = av1_convert_qindex_to_q(uVar18,aVar5);
        if ((cpi->refresh_frame).alt_ref_frame == false) {
          dVar32 = 0.5;
        }
        else {
          dVar32 = 0.4;
        }
LAB_00201324:
        iVar9 = av1_compute_qdelta(local_1088,dVar31,dVar32 * dVar31,aVar5);
        uVar10 = (cpi->rc).best_quality;
        uVar29 = iVar9 + uVar18;
        if ((int)(iVar9 + uVar18) <= (int)uVar10) {
          uVar29 = uVar10;
        }
      }
      else if (intra_only == AOM_CQ) {
        if ((int)uVar18 < (int)uVar29) {
          uVar18 = uVar29;
        }
        iVar14 = get_gf_active_quality
                           ((PRIMARY_RATE_CONTROL *)(ulong)(uint)(pAVar21->p_rc).gfu_boost,uVar18,
                            aVar5);
        iVar9 = iVar14 * 0xf + 0xf;
        if (-1 < iVar14 * 0xf) {
          iVar9 = iVar14 * 0xf;
        }
        uVar29 = iVar9 >> 4;
      }
      else {
        uVar29 = get_gf_active_quality
                           ((PRIMARY_RATE_CONTROL *)(ulong)(uint)(pAVar21->p_rc).gfu_boost,uVar29,
                            aVar5);
      }
    }
    else {
      if (intra_only == AOM_Q) {
        dVar32 = av1_convert_qindex_to_q(uVar18,aVar5);
        dVar31 = *(double *)
                  (&DAT_004fd330 + (ulong)((cpi->common).current_frame.frame_number & 0xf) * 8);
        goto LAB_00201238;
      }
      uVar10 = *(uint *)(puVar12 + (long)(pAVar21->p_rc).avg_frame_qindex[1 < uVar29] * 4);
      if ((int)uVar18 < (int)uVar10) {
        uVar18 = uVar10;
      }
      uVar29 = uVar18;
      if (intra_only != AOM_CQ) {
        uVar29 = uVar10;
      }
    }
    uVar18 = (cpi->rc).worst_quality;
    uVar10 = uVar18;
    if ((int)uVar29 < (int)uVar18) {
      uVar10 = uVar29;
    }
    uVar30 = (cpi->rc).best_quality;
    if ((int)uVar29 < (int)uVar30) {
      uVar10 = uVar30;
    }
    if ((int)uVar26 < (int)uVar18) {
      uVar18 = uVar26;
    }
    if ((int)uVar26 < (int)uVar10) {
      uVar18 = uVar10;
    }
    *top_index = uVar18;
    *bottom_index = uVar10;
    frame_type = (cpi->common).current_frame.frame_type;
    if (((frame_type == '\0') && ((pAVar21->p_rc).this_key_frame_forced == 0)) &&
       ((cpi->common).current_frame.frame_number != 0)) {
      dVar31 = 2.0;
      frame_type = '\0';
LAB_002018e3:
      iVar9 = av1_compute_qdelta_by_rate(cpi,frame_type,uVar18,dVar31);
    }
    else {
      iVar9 = 0;
      if (((cpi->rc).is_src_frame_alt_ref == 0) &&
         (((cpi->refresh_frame).golden_frame != false ||
          ((cpi->refresh_frame).alt_ref_frame == true)))) {
        dVar31 = 1.75;
        goto LAB_002018e3;
      }
    }
    iVar9 = iVar9 + uVar18;
    *top_index = iVar9;
    if (iVar9 <= *bottom_index) {
      iVar9 = *bottom_index;
    }
    *top_index = iVar9;
    if (intra_only != AOM_Q) {
      if (((cpi->common).current_frame.frame_type == '\0') &&
         ((pAVar21->p_rc).this_key_frame_forced != 0)) {
        uVar10 = (pAVar21->p_rc).last_boosted_qindex;
      }
      else {
        uVar29 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar10,uVar18,width,height);
        uVar10 = uVar29;
        if ((*top_index < (int)uVar29) &&
           (uVar10 = *top_index, (cpi->rc).max_frame_bandwidth <= (cpi->rc).this_frame_target)) {
          *top_index = uVar29;
          uVar10 = uVar29;
        }
      }
    }
    goto LAB_0020112b;
  }
  bVar2 = (cpi->common).current_frame.frame_type;
  superres_denom = cpi->superres_mode;
  bVar3 = (cpi->common).superres_scale_denominator;
  uVar29 = (cpi->oxcf).rc_cfg.cq_level;
  iVar9 = get_active_cq_level(&cpi->rc,&pAVar21->p_rc,(AV1EncoderConfig *)(ulong)uVar29,intra_only,
                              (uint)((bVar2 & 0xfd) == 0),superres_denom);
  puVar28 = local_1078;
  if (intra_only == AOM_Q) {
    if (bVar3 != 8 && superres_denom - AOM_SUPERRES_QTHRESH < 2) {
      iVar9 = 0;
      if ((bVar2 & 0xfd) == 0) {
        iVar9 = (uint)((cpi->rc).frames_to_key < 2) * 2 + -2;
      }
      uVar26 = (bVar3 - 8) * iVar9 + uVar29;
      uVar29 = 0;
      if (0 < (int)uVar26) {
        uVar29 = uVar26;
      }
    }
    local_1038[0] = 0;
    uVar26 = (cpi->rc).active_worst_quality;
    local_1094 = uVar26;
    if ((bVar2 & 0xfd) == 0) {
      get_intra_q_and_bounds(cpi,width,height,(int *)local_1038,(int *)&local_1094,uVar29);
    }
    else {
      local_1038[0] = get_active_best_quality(cpi,uVar26,uVar29,gf_index);
      local_1094 = uVar26;
    }
    uVar10 = 1;
    if (1 < (int)local_1038[0]) {
      uVar10 = local_1038[0];
    }
    if ((int)uVar29 < 1) {
      uVar10 = local_1038[0];
    }
    *local_1078 = local_1094;
    *local_1070 = uVar10;
    uVar29 = (cpi->rc).best_quality;
    if ((int)uVar29 < (int)*local_1078) {
      uVar29 = *local_1078;
    }
    *local_1078 = uVar29;
    uVar26 = (cpi->rc).worst_quality;
    if ((int)uVar26 <= (int)uVar29) {
      uVar29 = uVar26;
    }
    *local_1078 = uVar29;
    uVar29 = (cpi->rc).best_quality;
    if ((int)uVar29 < (int)*local_1070) {
      uVar29 = *local_1070;
    }
    *local_1070 = uVar29;
    uVar26 = (cpi->rc).worst_quality;
    if ((int)uVar26 <= (int)uVar29) {
      uVar29 = uVar26;
    }
    *local_1070 = uVar29;
    uVar29 = (cpi->rc).best_quality;
    if ((int)uVar10 <= (int)uVar29) {
      uVar10 = uVar29;
    }
    uVar29 = (cpi->rc).worst_quality;
    pAVar21 = local_1090;
    if ((int)uVar29 <= (int)uVar10) {
      uVar10 = uVar29;
    }
    goto LAB_0020112b;
  }
  local_1038[0] = 0;
  uVar29 = (cpi->rc).active_worst_quality;
  local_1094 = uVar29;
  if ((bVar2 & 0xfd) == 0) {
    get_intra_q_and_bounds(cpi,width,height,(int *)local_1038,(int *)&local_1094,iVar9);
    pAVar11 = cpi->ppi;
    puVar28 = local_1078;
    uVar29 = local_1094;
    uVar26 = local_1038[0];
    if ((cpi->oxcf).rc_cfg.mode != AOM_Q) goto LAB_00200eea;
  }
  else {
    FVar4 = (local_1090->gf_group).update_type[local_1060];
    iVar14 = (local_1090->gf_group).layer_depth[local_1060];
    if (iVar14 - 7U < 0xfffffffb) {
      local_1038[0] = get_active_best_quality(cpi,uVar29,iVar9,gf_index);
    }
    else {
      local_1038[0] = (local_1090->p_rc).active_best_quality[iVar14 - 1] + 1;
      if ((int)uVar29 <= (int)local_1038[0]) {
        local_1038[0] = uVar29;
      }
      local_1038[0] = (int)(uVar29 - local_1038[0]) / 2 + local_1038[0];
    }
    pAVar11 = local_1090;
    if (((cpi->rc).is_src_frame_alt_ref == 0) &&
       ((((cpi->refresh_frame).golden_frame != false ||
         ((cpi->refresh_frame).alt_ref_frame != false)) || (FVar4 == '\x06')))) {
      iVar14 = local_1038[0] + uVar29 * 3 + 2;
      iVar9 = local_1038[0] + uVar29 * 3 + 5;
      if (-1 < iVar14) {
        iVar9 = iVar14;
      }
      uVar29 = iVar9 >> 2;
      local_1094 = uVar29;
    }
LAB_00200eea:
    iVar9 = (pAVar11->twopass).extend_minq;
    iVar14 = (pAVar11->twopass).extend_maxq;
    iVar24 = iVar9 + 7;
    if (-1 < iVar9) {
      iVar24 = iVar9;
    }
    iVar9 = iVar14 + 3;
    if (-1 < iVar14) {
      iVar9 = iVar14;
    }
    uVar26 = local_1038[0] - (iVar24 >> 3);
    uVar29 = (iVar9 >> 2) + uVar29;
  }
  pAVar21 = local_1090;
  if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) ||
      ((pAVar11->p_rc).this_key_frame_forced == 0)) ||
     ((pAVar11->twopass).last_kfgroup_zeromotion_pct < 0x5f)) {
    bVar2 = cpi->gf_frame_index;
    if ((0x32UL >> ((ulong)(pAVar11->gf_group).update_type[bVar2] & 0x3f) & 1) == 0) {
      iVar9 = (pAVar11->gf_group).layer_depth[bVar2];
      iVar14 = 6;
      if (iVar9 < 6) {
        iVar14 = iVar9;
      }
      dVar31 = arf_layer_deltas[iVar14];
    }
    else {
      dVar31 = 1.0;
    }
    iVar9 = av1_compute_qdelta_by_rate(cpi,(pAVar11->gf_group).frame_type[bVar2],uVar29,dVar31);
    uVar29 = iVar9 + uVar29;
    if ((int)uVar29 <= (int)uVar26) {
      uVar29 = uVar26;
    }
  }
  iVar9 = (cpi->common).width;
  uVar18 = uVar26;
  if ((((iVar9 != (cpi->common).superres_upscaled_width) || (iVar9 != (cpi->common).render_width))
      || ((cpi->common).superres_upscaled_height != (cpi->common).render_height)) &&
     ((bVar2 = (cpi->common).current_frame.frame_type, (bVar2 & 0xfd) != 0 &&
      (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)))) {
    iVar9 = av1_compute_qdelta_by_rate(cpi,bVar2,uVar26,2.0);
    uVar10 = (cpi->rc).best_quality;
    uVar18 = iVar9 + uVar26;
    if ((int)(iVar9 + uVar26) <= (int)uVar10) {
      uVar18 = uVar10;
    }
  }
  uVar26 = (cpi->rc).worst_quality;
  uVar30 = uVar26;
  if ((int)uVar18 < (int)uVar26) {
    uVar30 = uVar18;
  }
  uVar10 = (cpi->rc).best_quality;
  if ((int)uVar18 < (int)uVar10) {
    uVar30 = uVar10;
  }
  if ((int)uVar29 < (int)uVar26) {
    uVar26 = uVar29;
  }
  if ((int)uVar29 < (int)uVar30) {
    uVar26 = uVar30;
  }
  uVar10 = uVar30;
  if ((cpi->oxcf).rc_cfg.mode != AOM_Q) {
    if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
      pAVar11 = cpi->ppi;
      if ((pAVar11->p_rc).this_key_frame_forced == 0) {
        if (((pAVar11->twopass).kf_zeromotion_pct < 99) || ((cpi->rc).frames_to_key < 2))
        goto LAB_0020103b;
      }
      else {
        uVar29 = (pAVar11->p_rc).last_boosted_qindex;
        if ((pAVar11->twopass).last_kfgroup_zeromotion_pct < 0x5f) {
          uVar18 = (int)(uVar26 + uVar30) / 2;
          if ((int)uVar18 <= (int)uVar29) {
            uVar29 = uVar18;
          }
        }
        else {
          uVar18 = (pAVar11->p_rc).last_kf_qindex;
          if ((int)uVar18 < (int)uVar29) {
            uVar29 = uVar18;
          }
        }
        uVar10 = uVar26;
        if ((int)uVar29 < (int)uVar26) {
          uVar10 = uVar29;
        }
        if ((int)uVar29 < (int)uVar30) {
          uVar10 = uVar30;
        }
      }
    }
    else {
LAB_0020103b:
      uVar10 = av1_rc_regulate_q(cpi,(cpi->rc).this_frame_target,uVar30,uVar26,width,height);
      if (((int)uVar26 < (int)uVar10) &&
         ((cpi->rc).this_frame_target < (cpi->rc).max_frame_bandwidth)) {
        uVar10 = uVar26;
      }
      if ((int)uVar10 <= (int)uVar30) {
        uVar10 = uVar30;
      }
    }
  }
  uVar29 = uVar26;
  if ((int)uVar26 < (int)uVar10) {
    uVar29 = uVar10;
  }
  if ((cpi->rc).this_frame_target < (cpi->rc).max_frame_bandwidth) {
    uVar29 = uVar26;
  }
  *puVar28 = uVar29;
  *local_1070 = uVar30;
LAB_0020112b:
  if ((pAVar21->gf_group).update_type[local_1060] == '\x03') {
    (pAVar21->p_rc).arf_q = uVar10;
  }
  return uVar10;
}

Assistant:

int av1_rc_pick_q_and_bounds(AV1_COMP *cpi, int width, int height, int gf_index,
                             int *bottom_index, int *top_index) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int q;
  // TODO(sarahparker) merge no-stats vbr and altref q computation
  // with rc_pick_q_and_bounds().
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if ((cpi->oxcf.rc_cfg.mode != AOM_Q ||
       gf_group->update_type[gf_index] == ARF_UPDATE) &&
      has_no_stats_stage(cpi)) {
    if (cpi->oxcf.rc_cfg.mode == AOM_CBR) {
      // TODO(yunqing): the results could be used for encoder optimization.
      cpi->rec_sse = UINT64_MAX;
      if (cpi->sf.hl_sf.accurate_bit_estimate &&
          cpi->common.current_frame.frame_type != KEY_FRAME)
        rc_compute_variance_onepass_rt(cpi);

      q = rc_pick_q_and_bounds_no_stats_cbr(cpi, width, height, bottom_index,
                                            top_index);
      // preserve copy of active worst quality selected.
      cpi->rc.active_worst_quality = *top_index;

#if USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else if (cpi->oxcf.rc_cfg.mode == AOM_CQ) {
      q = rc_pick_q_and_bounds_no_stats_cq(cpi, width, height, bottom_index,
                                           top_index);
#endif  // USE_UNRESTRICTED_Q_IN_CQ_MODE
    } else {
      q = rc_pick_q_and_bounds_no_stats(cpi, width, height, bottom_index,
                                        top_index);
    }
  } else {
    q = rc_pick_q_and_bounds(cpi, width, height, gf_index, bottom_index,
                             top_index);
  }
  if (gf_group->update_type[gf_index] == ARF_UPDATE) p_rc->arf_q = q;

  return q;
}